

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void grow_hash(archive_entry_linkresolver *res)

{
  links_entry *plVar1;
  ulong __nmemb;
  links_entry **pplVar2;
  ulong uVar3;
  size_t bucket;
  size_t i;
  size_t new_size;
  links_entry **new_buckets;
  links_entry *le;
  archive_entry_linkresolver *res_local;
  
  __nmemb = res->number_buckets * 2;
  if ((res->number_buckets <= __nmemb) &&
     (pplVar2 = (links_entry **)calloc(__nmemb,8), pplVar2 != (links_entry **)0x0)) {
    for (bucket = 0; bucket < res->number_buckets; bucket = bucket + 1) {
      while (res->buckets[bucket] != (links_entry *)0x0) {
        plVar1 = res->buckets[bucket];
        res->buckets[bucket] = plVar1->next;
        uVar3 = plVar1->hash & __nmemb - 1;
        if (pplVar2[uVar3] != (links_entry *)0x0) {
          pplVar2[uVar3]->previous = plVar1;
        }
        plVar1->next = pplVar2[uVar3];
        plVar1->previous = (links_entry *)0x0;
        pplVar2[uVar3] = plVar1;
      }
    }
    free(res->buckets);
    res->buckets = pplVar2;
    res->number_buckets = __nmemb;
  }
  return;
}

Assistant:

static void
grow_hash(struct archive_entry_linkresolver *res)
{
	struct links_entry *le, **new_buckets;
	size_t new_size;
	size_t i, bucket;

	/* Try to enlarge the bucket list. */
	new_size = res->number_buckets * 2;
	if (new_size < res->number_buckets)
		return;
	new_buckets = calloc(new_size, sizeof(struct links_entry *));

	if (new_buckets == NULL)
		return;

	for (i = 0; i < res->number_buckets; i++) {
		while (res->buckets[i] != NULL) {
			/* Remove entry from old bucket. */
			le = res->buckets[i];
			res->buckets[i] = le->next;

			/* Add entry to new bucket. */
			bucket = le->hash & (new_size - 1);

			if (new_buckets[bucket] != NULL)
				new_buckets[bucket]->previous = le;
			le->next = new_buckets[bucket];
			le->previous = NULL;
			new_buckets[bucket] = le;
		}
	}
	free(res->buckets);
	res->buckets = new_buckets;
	res->number_buckets = new_size;
}